

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O3

bool __thiscall
higan::MultiplexEpoll::LoopOnce(MultiplexEpoll *this,int timeout,ChannelList *active_channel_list)

{
  epoll_event *__events;
  uint active_event_num;
  LogLevel LVar1;
  int *piVar2;
  Logger local_238;
  
  __events = (epoll_event *)
             (this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
             _M_impl.super__Vector_impl_data._M_start;
  active_event_num =
       epoll_wait(this->epollfd_,__events,
                  (int)((ulong)((long)(this->epoll_events_).
                                      super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)__events) >>
                       2) * -0x55555555,timeout);
  if ((int)active_event_num < 1) {
    if (active_event_num == 0) {
      return true;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      LVar1 = Logger::GetLogLevel();
      if ((int)LVar1 < 4) {
        Logger::Logger(&local_238,ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/multiplexing/MultiplexEpoll.cpp"
                       ,0x32,"LoopOnce");
        Logger::operator<<(&local_238,"epoll_wait error");
        Logger::~Logger(&local_238);
      }
      exit(*piVar2);
    }
  }
  else {
    FillActiveChannelList(this,active_event_num,active_channel_list);
    if (((long)(this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
               _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 -
        (ulong)active_event_num == 0) {
      std::vector<epoll_event,_std::allocator<epoll_event>_>::resize
                (&this->epoll_events_,(ulong)active_event_num * 2);
    }
  }
  return false;
}

Assistant:

bool MultiplexEpoll::LoopOnce(int timeout, MultiplexBase::ChannelList* active_channel_list)
{
	// EPOLLET 模式下如果maxevents太小 导致无法接受全部event 并不会丢弃 只有接收来的才会被丢弃
	int event_num = epoll_wait(epollfd_, &*epoll_events_.begin(), static_cast<int>(epoll_events_.size()), timeout);

	if (event_num > 0)
	{
		FillActiveChannelList(event_num, active_channel_list);
		if(static_cast<size_t>(event_num) == epoll_events_.size())
		{
			epoll_events_.resize(epoll_events_.size() * 2);
		}
	}
	else if (event_num == 0)
	{
		return true;
	}
	else if (event_num < 0)
	{
		if (errno != EINTR)
		{
			LOG_ERROR << "epoll_wait error";
			exit(errno);
		}
	}

	return false;
}